

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditional_entropy.c
# Opt level: O3

double * inform_local_conditional_entropy
                   (int *xs,int *ys,size_t n,int bx,int by,double *ce,inform_error *err)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  _Bool _Var3;
  double *__ptr;
  inform_dist *dist;
  inform_dist *dist_00;
  size_t sVar4;
  size_t i;
  double dVar5;
  
  _Var3 = check_arguments(xs,ys,n,bx,by,err);
  if (!_Var3) {
    __ptr = ce;
    if ((ce == (double *)0x0) && (__ptr = (double *)malloc(n * 8), __ptr == (double *)0x0)) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
    }
    else {
      dist = inform_dist_alloc((long)bx);
      if (dist != (inform_dist *)0x0) {
        dist_00 = inform_dist_alloc((long)(bx * by));
        if (dist_00 != (inform_dist *)0x0) {
          dist->counts = n;
          dist_00->counts = n;
          if (n != 0) {
            puVar1 = dist->histogram;
            puVar2 = dist_00->histogram;
            sVar4 = 0;
            do {
              puVar1[xs[sVar4]] = puVar1[xs[sVar4]] + 1;
              puVar2[(long)ys[sVar4] + (long)xs[sVar4] * (long)by] =
                   puVar2[(long)ys[sVar4] + (long)xs[sVar4] * (long)by] + 1;
              sVar4 = sVar4 + 1;
            } while (n != sVar4);
            sVar4 = 0;
            do {
              dVar5 = log2((double)dist->histogram[xs[sVar4]] /
                           (double)dist_00->histogram[(long)ys[sVar4] + (long)xs[sVar4] * (long)by])
              ;
              __ptr[sVar4] = dVar5;
              sVar4 = sVar4 + 1;
            } while (n != sVar4);
          }
          inform_dist_free(dist);
          inform_dist_free(dist_00);
          return __ptr;
        }
        inform_dist_free(dist);
      }
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
      if (ce == (double *)0x0) {
        free(__ptr);
      }
    }
  }
  return (double *)0x0;
}

Assistant:

double *inform_local_conditional_entropy(int const *xs, int const *ys,
    size_t n, int bx, int by, double *ce, inform_error *err)
{
    if (check_arguments(xs, ys, n, bx, by, err)) return NULL;

    bool allocate_ce = (ce == NULL);
    if (allocate_ce)
    {
        ce = malloc(n * sizeof(double));
        if (ce == NULL)
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    inform_dist *x = NULL, *xy = NULL;
    if (allocate(bx, by, &x, &xy, err))
    {
        if (allocate_ce) free(ce);
        return NULL;
    }

    accumulate(xs, ys, n, by, x, xy);

    double s, m;
    for (size_t i = 0; i < n; ++i)
    {
        int z = xs[i]*by + ys[i];
        s = xy->histogram[z];
        m = x->histogram[xs[i]];
        ce[i] = log2(m/s);
    }

    free_all(&x, &xy);

    return ce;
}